

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

mg_context * mg_start2(mg_init_data *init,mg_error_data *error)

{
  mg_callbacks *__src;
  _func_void_mg_context_ptr *p_Var1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  mg_context *ctx;
  uint64_t uVar9;
  uint *puVar10;
  void *pvVar11;
  socket *psVar12;
  pthread_t *ppVar13;
  mg_connection *pmVar14;
  long in_RCX;
  ulong uVar15;
  size_t sVar16;
  char *func;
  char *func_00;
  mg_context *ctx_00;
  mg_context *ctx_01;
  char *func_01;
  char *func_02;
  char *func_03;
  char *func_04;
  char *func_05;
  char *func_06;
  char *func_07;
  char *func_08;
  char *func_09;
  char *func_10;
  char *func_11;
  char *pcVar17;
  int i;
  long lVar18;
  uint uVar19;
  mg_domain_context *dom_ctx;
  char *pcVar20;
  char *fmt;
  char **ppcVar21;
  mg_option *pmVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  mg_workerTLS tls;
  _func_void_mg_context_ptr *local_80;
  usa local_78;
  undefined4 local_50 [2];
  ulong local_48;
  
  if (init == (mg_init_data *)0x0) {
    ppcVar21 = (char **)0x0;
  }
  else {
    ppcVar21 = init->configuration_options;
  }
  if ((error != (mg_error_data *)0x0) &&
     (error->code = 0, error->code_sub = 0, error->text_buffer_size != 0)) {
    *error->text = '\0';
  }
  if (mg_init_library_called == 0) {
    pcVar17 = "8080";
    if ((ppcVar21 != (char **)0x0) && (pcVar20 = *ppcVar21, pcVar20 != (char *)0x0)) {
      pcVar17 = "8080";
      ppcVar2 = ppcVar21;
      do {
        iVar3 = strcmp(pcVar20,"listening_ports");
        if (iVar3 == 0) {
          pcVar17 = ppcVar2[1];
        }
        pcVar20 = ppcVar2[2];
        ppcVar2 = ppcVar2 + 2;
      } while (pcVar20 != (char *)0x0);
    }
    uVar19 = 0;
    if (pcVar17 != (char *)0x0) {
      sVar8 = strlen(pcVar17);
      uVar19 = 0;
      if (0 < (int)(uint)sVar8) {
        uVar24 = (ulong)((uint)sVar8 & 0x7fffffff);
        in_RCX = -uVar24;
        bVar25 = false;
        uVar19 = 1;
        uVar15 = 1;
        do {
          if ((bVar25) && ((pcVar17[uVar15 - 1] & 0xfeU) == 0x72)) {
            uVar19 = uVar19 * 2;
            goto LAB_0011464e;
          }
          bVar25 = (byte)(pcVar17[uVar15 - 1] - 0x30U) < 10;
          uVar19 = (uint)(uVar15 < uVar24);
          bVar26 = uVar15 != uVar24;
          uVar15 = uVar15 + 1;
        } while (bVar26);
        uVar19 = 0;
      }
    }
LAB_0011464e:
    mg_init_library(uVar19);
  }
  if (mg_init_library_called == 0) {
    if (error == (mg_error_data *)0x0) {
      return (mg_context *)0x0;
    }
    error->code = 8;
    pcVar17 = error->text;
    sVar16 = error->text_buffer_size;
    pcVar20 = "Library uninitialized";
LAB_001147d6:
    mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar17,sVar16,"%s",pcVar20);
    return (mg_context *)0x0;
  }
  ctx = (mg_context *)calloc(1,0x285a8);
  if (ctx == (mg_context *)0x0) {
    if (error == (mg_error_data *)0x0) {
      return (mg_context *)0x0;
    }
    error->code = 6;
    error->code_sub = 0x285a8;
    pcVar17 = error->text;
    sVar16 = error->text_buffer_size;
    pcVar20 = "Out of memory";
    goto LAB_001147d6;
  }
  uVar9 = get_random();
  (ctx->dd).auth_nonce_mask = uVar9 ^ (ulong)ppcVar21;
  LOCK();
  UNLOCK();
  local_48 = (ulong)((int)thread_idx_max + 1);
  thread_idx_max = thread_idx_max + 1;
  ctx->starter_thread_idx = local_48;
  local_50[0] = 0xffffffff;
  pthread_setspecific(sTlsKey,local_50);
  iVar3 = pthread_mutex_init((pthread_mutex_t *)&ctx->thread_mutex,
                             (pthread_mutexattr_t *)&pthread_mutex_attr);
  iVar4 = pthread_cond_init((pthread_cond_t *)&ctx->sq_empty,(pthread_condattr_t *)0x0);
  iVar5 = pthread_cond_init((pthread_cond_t *)&ctx->sq_full,(pthread_condattr_t *)0x0);
  ctx->sq_blocked = 0;
  iVar6 = pthread_mutex_init((pthread_mutex_t *)&ctx->nonce_mutex,
                             (pthread_mutexattr_t *)&pthread_mutex_attr);
  uVar19 = (uint)in_RCX;
  if (iVar6 == 0 && (iVar5 == 0 && (iVar4 == 0 && iVar3 == 0))) {
    if ((init == (mg_init_data *)0x0) || (__src = init->callbacks, __src == (mg_callbacks *)0x0)) {
      local_80 = (_func_void_mg_context_ptr *)0x0;
    }
    else {
      memcpy(&ctx->callbacks,__src,0x90);
      local_80 = __src->exit_context;
      (ctx->callbacks).exit_context = (_func_void_mg_context_ptr *)0x0;
    }
    if (init == (mg_init_data *)0x0) {
      pvVar11 = (void *)0x0;
    }
    else {
      pvVar11 = init->user_data;
    }
    ctx->user_data = pvVar11;
    (ctx->dd).handlers = (mg_handler_info *)0x0;
    (ctx->dd).next = (mg_domain_context *)0x0;
    if (ppcVar21 != (char **)0x0) {
      pcVar17 = *ppcVar21;
      while (pcVar17 != (char *)0x0) {
        pmVar22 = config_options;
        lVar18 = 0;
        pcVar20 = "listening_ports";
        do {
          pmVar22 = pmVar22 + 1;
          iVar3 = strcmp(pcVar20,pcVar17);
          if (iVar3 == 0) goto LAB_00114897;
          lVar18 = lVar18 + 1;
          pcVar20 = pmVar22->name;
        } while (lVar18 != 0x3a);
        lVar18 = 0xffffffff;
LAB_00114897:
        uVar7 = (uint)lVar18;
        uVar19 = (uint)in_RCX;
        if (uVar7 == 0xffffffff) {
          mg_cry_internal_wrap((mg_connection *)0x0,ctx,func_00,uVar19,"Invalid option: %s",pcVar17)
          ;
          if (error == (mg_error_data *)0x0) goto LAB_00114b86;
          error->code = 2;
          error->code_sub = 0xffffffff;
          pcVar20 = error->text;
          sVar16 = error->text_buffer_size;
          fmt = "Invalid configuration option: %s";
          goto LAB_00114b7f;
        }
        pcVar20 = ppcVar21[1];
        if (pcVar20 == (char *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,ctx,func_00,uVar19,"%s: option value cannot be NULL",
                     pcVar17);
          if (error == (mg_error_data *)0x0) goto LAB_00114b86;
          error->code = 2;
          error->code_sub = uVar7;
          pcVar20 = error->text;
          sVar16 = error->text_buffer_size;
          fmt = "Invalid configuration option value: %s";
          goto LAB_00114b7f;
        }
        if ((ctx->dd).config[(int)uVar7] != (char *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,ctx,func_00,uVar19,"warning: %s: duplicate option",pcVar17
                    );
          free((ctx->dd).config[(int)uVar7]);
        }
        ppcVar21 = ppcVar21 + 2;
        sVar8 = strlen(pcVar20);
        pcVar17 = mg_strndup_ctx(pcVar20,sVar8,ctx_00);
        (ctx->dd).config[(int)uVar7] = pcVar17;
        pcVar17 = *ppcVar21;
      }
    }
    lVar18 = 0x5076;
    ppcVar21 = &config_options[0].default_value;
    do {
      pcVar17 = *ppcVar21;
      bVar25 = *(long *)(&ctx->context_type + lVar18 * 2) == 0;
      in_RCX = CONCAT71((int7)((ulong)in_RCX >> 8),pcVar17 != (char *)0x0 && bVar25);
      if (pcVar17 != (char *)0x0 && bVar25) {
        sVar8 = strlen(pcVar17);
        pcVar17 = mg_strndup_ctx(pcVar17,sVar8,ctx_01);
        *(char **)(&ctx->context_type + lVar18 * 2) = pcVar17;
      }
      uVar19 = (uint)in_RCX;
      lVar18 = lVar18 + 1;
      ppcVar21 = ppcVar21 + 3;
    } while (lVar18 != 0x50b0);
    uVar7 = atoi((ctx->dd).config[4]);
    if ((int)uVar7 < 0x400) {
      mg_cry_internal_wrap
                ((mg_connection *)0x0,ctx,func_01,uVar19,"%s too small","max_request_size");
      if (error != (mg_error_data *)0x0) {
        error->code = 2;
        error->code_sub = 4;
        pcVar20 = error->text;
        sVar16 = error->text_buffer_size;
        fmt = "Invalid configuration option value: %s";
        pcVar17 = "max_request_size";
        goto LAB_00114b7f;
      }
    }
    else {
      ctx->max_request_size = uVar7;
      uVar7 = atoi((ctx->dd).config[6]);
      if ((int)uVar7 < 1) {
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,ctx,func_02,uVar19,"%s too small","connection_queue");
        if (error != (mg_error_data *)0x0) {
          error->code = 2;
          error->code_sub = 6;
          pcVar20 = error->text;
          sVar16 = error->text_buffer_size;
          fmt = "Invalid configuration option value: %s";
LAB_00114b74:
          pcVar17 = "connection_queue";
LAB_00114b7f:
          mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar20,sVar16,fmt,pcVar17);
        }
      }
      else {
        dom_ctx = (mg_domain_context *)0x40;
        psVar12 = (socket *)calloc((ulong)uVar7,0x40);
        ctx->squeue = psVar12;
        if (psVar12 == (socket *)0x0) {
          mg_cry_internal_wrap
                    ((mg_connection *)0x0,ctx,func_03,uVar19,"Out of memory: Cannot allocate %s",
                     "connection_queue");
          if (error != (mg_error_data *)0x0) {
            error->code = 6;
            error->code_sub = uVar7 << 6;
            pcVar20 = error->text;
            sVar16 = error->text_buffer_size;
            fmt = "Out of memory: Cannot allocate %s";
            goto LAB_00114b74;
          }
        }
        else {
          ctx->sq_size = uVar7;
          uVar7 = atoi((ctx->dd).config[1]);
          uVar19 = uVar7 - 0x10001;
          uVar15 = (ulong)uVar19;
          if (uVar19 < 0xffff0000) {
            pcVar17 = "Too many worker threads";
            if ((int)uVar7 < 1) {
              pcVar17 = "Invalid number of worker threads";
            }
            mg_cry_internal_wrap((mg_connection *)0x0,ctx,func_04,uVar19,"%s",pcVar17);
            if (error != (mg_error_data *)0x0) {
              error->code = 2;
              error->code_sub = 1;
              pcVar20 = error->text;
              sVar16 = error->text_buffer_size;
              fmt = "Invalid configuration option value: %s";
              pcVar17 = "num_threads";
              goto LAB_00114b7f;
            }
          }
          else if ((ctx->dd).config[0xf] == (char *)0x0) {
            get_system_name(&ctx->systemName);
            iVar3 = set_gpass_option(ctx,dom_ctx);
            if (iVar3 == 0) {
              mg_cry_internal_wrap
                        ((mg_connection *)0x0,ctx,func_05,(uint)uVar15,"%s",
                         "Invalid global password file");
              if (error != (mg_error_data *)0x0) {
                error->code = 0xd;
                pcVar20 = error->text;
                sVar16 = error->text_buffer_size;
                fmt = "%s";
                pcVar17 = "Invalid global password file";
                goto LAB_00114b7f;
              }
            }
            else {
              iVar3 = set_ports_option(ctx);
              if (iVar3 == 0) {
                mg_cry_internal_wrap
                          ((mg_connection *)0x0,ctx,func_06,(uint)uVar15,"%s",
                           "Failed to setup server ports");
                if (error != (mg_error_data *)0x0) {
                  error->code = 10;
                  pcVar20 = error->text;
                  sVar16 = error->text_buffer_size;
                  fmt = "%s";
                  pcVar17 = "Failed to setup server ports";
                  goto LAB_00114b7f;
                }
              }
              else {
                iVar3 = set_uid_option(ctx);
                if (iVar3 == 0) {
                  mg_cry_internal_wrap
                            ((mg_connection *)0x0,ctx,func_07,(uint)uVar15,"%s",
                             "Failed to run as configured user");
                  if (error != (mg_error_data *)0x0) {
                    error->code = 0xb;
                    pcVar20 = error->text;
                    sVar16 = error->text_buffer_size;
                    fmt = "%s";
                    pcVar17 = "Failed to run as configured user";
                    goto LAB_00114b7f;
                  }
                }
                else {
                  local_78._8_4_ = 0;
                  local_78._12_4_ = 0;
                  local_78._16_4_ = 0;
                  local_78._20_8_ = 0;
                  local_78._0_8_ = 10;
                  iVar3 = check_acl(ctx,&local_78);
                  if (iVar3 == -1) {
                    mg_cry_internal_wrap
                              ((mg_connection *)0x0,ctx,func_08,(uint)uVar15,"%s",
                               "Failed to setup access control list");
                    if (error != (mg_error_data *)0x0) {
                      error->code = 0xc;
                      pcVar20 = error->text;
                      sVar16 = error->text_buffer_size;
                      fmt = "%s";
                      pcVar17 = "Failed to setup access control list";
                      goto LAB_00114b7f;
                    }
                  }
                  else {
                    ctx->cfg_worker_threads = uVar7;
                    ppVar13 = (pthread_t *)calloc((ulong)uVar7,8);
                    ctx->worker_threadids = ppVar13;
                    if (ppVar13 == (pthread_t *)0x0) {
                      mg_cry_internal_wrap
                                ((mg_connection *)0x0,ctx,func_09,(uint)uVar15,"%s",
                                 "Not enough memory for worker thread ID array");
                      if (error != (mg_error_data *)0x0) {
                        error->code = 6;
                        error->code_sub = ctx->cfg_worker_threads << 3;
                        pcVar20 = error->text;
                        sVar16 = error->text_buffer_size;
                        fmt = "%s";
                        pcVar17 = "Not enough memory for worker thread ID array";
                        goto LAB_00114b7f;
                      }
                    }
                    else {
                      pmVar14 = (mg_connection *)calloc((ulong)uVar7,0x9e8);
                      ctx->worker_connections = pmVar14;
                      if (pmVar14 != (mg_connection *)0x0) {
                        p_Var1 = (ctx->callbacks).init_context;
                        if (p_Var1 != (_func_void_mg_context_ptr *)0x0) {
                          (*p_Var1)(ctx);
                        }
                        (ctx->callbacks).exit_context = local_80;
                        ctx->context_type = 1;
                        if (ctx->cfg_worker_threads != 0) {
                          lVar18 = 0;
                          lVar23 = 0;
                          uVar24 = 0;
                          do {
                            pmVar14 = ctx->worker_connections;
                            *(mg_context **)((long)&pmVar14->phys_ctx + lVar23) = ctx;
                            iVar3 = mg_start_thread_with_id
                                              (worker_thread,
                                               (pmVar14->request_info).remote_addr + lVar23 + -0x48,
                                               (pthread_t *)((long)ctx->worker_threadids + lVar18));
                            uVar19 = (uint)uVar15;
                            if (iVar3 != 0) {
                              puVar10 = (uint *)__errno_location();
                              uVar7 = *puVar10;
                              lVar18 = (long)(int)uVar7;
                              if (uVar24 == 0) {
                                mg_cry_internal_wrap
                                          ((mg_connection *)0x0,ctx,func_11,uVar19,
                                           "Cannot create threads: error %ld",lVar18);
                                if (error != (mg_error_data *)0x0) {
                                  error->code = 9;
                                  error->code_sub = uVar7;
                                  mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,
                                              error->text_buffer_size,
                                              "Cannot create first worker thread: error %ld",lVar18)
                                  ;
                                }
                                free_context(ctx);
                                pthread_setspecific(sTlsKey,(void *)0x0);
                              }
                              else {
                                mg_cry_internal_wrap
                                          ((mg_connection *)0x0,ctx,func_11,uVar19,
                                           "Cannot start worker thread %i: error %ld",
                                           (ulong)((int)uVar24 + 1),lVar18);
                              }
                              if (uVar24 == 0) {
                                return (mg_context *)0x0;
                              }
                              break;
                            }
                            uVar24 = uVar24 + 1;
                            lVar23 = lVar23 + 0x9e8;
                            lVar18 = lVar18 + 8;
                          } while (uVar24 < ctx->cfg_worker_threads);
                        }
                        mg_start_thread_with_id(master_thread,ctx,&ctx->masterthreadid);
                        goto LAB_00114b96;
                      }
                      mg_cry_internal_wrap
                                ((mg_connection *)0x0,ctx,func_10,(uint)uVar15,"%s",
                                 "Not enough memory for worker thread connection array");
                      if (error != (mg_error_data *)0x0) {
                        error->code = 6;
                        error->code_sub = ctx->cfg_worker_threads * 0x9e8;
                        pcVar20 = error->text;
                        sVar16 = error->text_buffer_size;
                        fmt = "%s";
                        pcVar17 = "Not enough memory for worker thread connection array";
                        goto LAB_00114b7f;
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            mg_cry_internal_wrap
                      ((mg_connection *)0x0,ctx,func_04,uVar19,"%s","Document root must not be set")
            ;
            if (error != (mg_error_data *)0x0) {
              error->code = 2;
              error->code_sub = 0xf;
              pcVar20 = error->text;
              sVar16 = error->text_buffer_size;
              fmt = "Invalid configuration option value: %s";
              pcVar17 = "document_root";
              goto LAB_00114b7f;
            }
          }
        }
      }
    }
LAB_00114b86:
    free_context(ctx);
  }
  else {
    puVar10 = (uint *)__errno_location();
    uVar7 = *puVar10;
    mg_cry_internal_wrap
              ((mg_connection *)0x0,ctx,func,uVar19,"%s",
               "Cannot initialize thread synchronization objects");
    if (error != (mg_error_data *)0x0) {
      error->code = 9;
      error->code_sub = uVar7;
      mg_snprintf((mg_connection *)0x0,(int *)0x0,error->text,error->text_buffer_size,"%s",
                  "Cannot initialize thread synchronization objects");
    }
    free(ctx);
  }
  ctx = (mg_context *)0x0;
LAB_00114b96:
  pthread_setspecific(sTlsKey,(void *)0x0);
  return ctx;
}

Assistant:

mg_context *
mg_start2(struct mg_init_data *init, struct mg_error_data *error)
{
	struct mg_context *ctx;
	const char *name, *value, *default_value;
	int idx, ok, workerthreadcount;
	unsigned int i;
	int itmp;
	void (*exit_callback)(const struct mg_context *ctx) = 0;
	const char **options =
	    ((init != NULL) ? (init->configuration_options) : (NULL));

	struct mg_workerTLS tls;

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			*error->text = 0;
		}
	}

	if (mg_init_library_called == 0) {
		/* Legacy INIT, if mg_start is called without mg_init_library.
		 * Note: This will cause a memory leak when unloading the library.
		 */
		legacy_init(options);
	}
	if (mg_init_library_called == 0) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_LIBRARY_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Library uninitialized");
		}
		return NULL;
	}

	/* Allocate context and initialize reasonable general case defaults. */
	ctx = (struct mg_context *)mg_calloc(1, sizeof(*ctx));
	if (ctx == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)sizeof(*ctx);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            "Out of memory");
		}
		return NULL;
	}

	/* Random number generator will initialize at the first call */
	ctx->dd.auth_nonce_mask =
	    (uint64_t)get_random() ^ (uint64_t)(ptrdiff_t)(options);

	/* Save started thread index to reuse in other external API calls
	 * For the sake of thread synchronization all non-civetweb threads
	 * can be considered as single external thread */
	ctx->starter_thread_idx = (unsigned)mg_atomic_inc(&thread_idx_max);
	tls.is_master = -1; /* Thread calling mg_start */
	tls.thread_idx = ctx->starter_thread_idx;
#if defined(_WIN32)
	tls.pthread_cond_helper_mutex = NULL;
#endif
	pthread_setspecific(sTlsKey, &tls);

	ok = (0 == pthread_mutex_init(&ctx->thread_mutex, &pthread_mutex_attr));
#if !defined(ALTERNATIVE_QUEUE)
	ok &= (0 == pthread_cond_init(&ctx->sq_empty, NULL));
	ok &= (0 == pthread_cond_init(&ctx->sq_full, NULL));
	ctx->sq_blocked = 0;
#endif
	ok &= (0 == pthread_mutex_init(&ctx->nonce_mutex, &pthread_mutex_attr));
#if defined(USE_LUA)
	ok &= (0 == pthread_mutex_init(&ctx->lua_bg_mutex, &pthread_mutex_attr));
#endif
	if (!ok) {
		unsigned error_id = (unsigned)ERRNO;
		const char *err_msg =
		    "Cannot initialize thread synchronization objects";
		/* Fatal error - abort start. However, this situation should never
		 * occur in practice. */

		mg_cry_ctx_internal(ctx, "%s", err_msg);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = error_id;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		mg_free(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	if ((init != NULL) && (init->callbacks != NULL)) {
		/* Set all callbacks except exit_context. */
		ctx->callbacks = *init->callbacks;
		exit_callback = init->callbacks->exit_context;
		/* The exit callback is activated once the context is successfully
		 * created. It should not be called, if an incomplete context object
		 * is deleted during a failed initialization. */
		ctx->callbacks.exit_context = 0;
	}
	ctx->user_data = ((init != NULL) ? (init->user_data) : (NULL));
	ctx->dd.handlers = NULL;
	ctx->dd.next = NULL;

#if defined(USE_LUA)
	lua_ctx_init(ctx);
#endif

	/* Store options */
	while (options && (name = *options++) != NULL) {
		idx = get_option_index(name);
		if (idx == -1) {
			mg_cry_ctx_internal(ctx, "Invalid option: %s", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)-1;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid configuration option: %s",
				            name);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;

		} else if ((value = *options++) == NULL) {
			mg_cry_ctx_internal(ctx, "%s: option value cannot be NULL", name);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
				error->code_sub = (unsigned)idx;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Invalid configuration option value: %s",
				            name);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}
		if (ctx->dd.config[idx] != NULL) {
			/* A duplicate configuration option is not an error - the last
			 * option value will be used. */
			mg_cry_ctx_internal(ctx, "warning: %s: duplicate option", name);
			mg_free(ctx->dd.config[idx]);
		}
		ctx->dd.config[idx] = mg_strdup_ctx(value, ctx);
		DEBUG_TRACE("[%s] -> [%s]", name, value);
	}

	/* Set default value if needed */
	for (i = 0; config_options[i].name != NULL; i++) {
		default_value = config_options[i].default_value;
		if ((ctx->dd.config[i] == NULL) && (default_value != NULL)) {
			ctx->dd.config[i] = mg_strdup_ctx(default_value, ctx);
		}
	}

	/* Request size option */
	itmp = atoi(ctx->dd.config[MAX_REQUEST_SIZE]);
	if (itmp < 1024) {
		mg_cry_ctx_internal(ctx,
		                    "%s too small",
		                    config_options[MAX_REQUEST_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = (unsigned)MAX_REQUEST_SIZE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[MAX_REQUEST_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->max_request_size = (unsigned)itmp;

	/* Queue length */
#if !defined(ALTERNATIVE_QUEUE)
	itmp = atoi(ctx->dd.config[CONNECTION_QUEUE_SIZE]);
	if (itmp < 1) {
		mg_cry_ctx_internal(ctx,
		                    "%s too small",
		                    config_options[CONNECTION_QUEUE_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = CONNECTION_QUEUE_SIZE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[CONNECTION_QUEUE_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->squeue =
	    (struct socket *)mg_calloc((unsigned int)itmp, sizeof(struct socket));
	if (ctx->squeue == NULL) {
		mg_cry_ctx_internal(ctx,
		                    "Out of memory: Cannot allocate %s",
		                    config_options[CONNECTION_QUEUE_SIZE].name);
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)itmp * (unsigned)sizeof(struct socket);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Out of memory: Cannot allocate %s",
			            config_options[CONNECTION_QUEUE_SIZE].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->sq_size = itmp;
#endif

	/* Worker thread count option */
	workerthreadcount = atoi(ctx->dd.config[NUM_THREADS]);

	if ((workerthreadcount > MAX_WORKER_THREADS) || (workerthreadcount <= 0)) {
		if (workerthreadcount <= 0) {
			mg_cry_ctx_internal(ctx, "%s", "Invalid number of worker threads");
		} else {
			mg_cry_ctx_internal(ctx, "%s", "Too many worker threads");
		}
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = NUM_THREADS;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[NUM_THREADS].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	/* Document root */
#if defined(NO_FILES)
	if (ctx->dd.config[DOCUMENT_ROOT] != NULL) {
		mg_cry_ctx_internal(ctx, "%s", "Document root must not be set");
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_OPTION;
			error->code_sub = (unsigned)DOCUMENT_ROOT;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "Invalid configuration option value: %s",
			            config_options[DOCUMENT_ROOT].name);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	get_system_name(&ctx->systemName);

#if defined(USE_LUA)
	/* If a Lua background script has been configured, start it. */
	ctx->lua_bg_log_available = 0;
	if (ctx->dd.config[LUA_BACKGROUND_SCRIPT] != NULL) {
		char ebuf[256];
		struct vec opt_vec;
		struct vec eq_vec;
		const char *sparams;

		memset(ebuf, 0, sizeof(ebuf));
		pthread_mutex_lock(&ctx->lua_bg_mutex);

		/* Create a Lua state, load all standard libraries and the mg table */
		lua_State *state = mg_lua_context_script_prepare(
		    ctx->dd.config[LUA_BACKGROUND_SCRIPT], ctx, ebuf, sizeof(ebuf));
		if (!state) {
			mg_cry_ctx_internal(ctx,
			                    "lua_background_script load error: %s",
			                    ebuf);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_SCRIPT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Error in script %s: %s",
				            config_options[LUA_BACKGROUND_SCRIPT].name,
				            ebuf);
			}

			pthread_mutex_unlock(&ctx->lua_bg_mutex);

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}

		/* Add a table with parameters into mg.params */
		sparams = ctx->dd.config[LUA_BACKGROUND_SCRIPT_PARAMS];
		if (sparams && sparams[0]) {
			lua_getglobal(state, "mg");
			lua_pushstring(state, "params");
			lua_newtable(state);

			while ((sparams = next_option(sparams, &opt_vec, &eq_vec))
			       != NULL) {
				reg_llstring(
				    state, opt_vec.ptr, opt_vec.len, eq_vec.ptr, eq_vec.len);
				if (mg_strncasecmp(sparams, opt_vec.ptr, opt_vec.len) == 0)
					break;
			}
			lua_rawset(state, -3);
			lua_pop(state, 1);
		}

		/* Call script */
		state = mg_lua_context_script_run(state,
		                                  ctx->dd.config[LUA_BACKGROUND_SCRIPT],
		                                  ctx,
		                                  ebuf,
		                                  sizeof(ebuf));
		if (!state) {
			mg_cry_ctx_internal(ctx,
			                    "lua_background_script start error: %s",
			                    ebuf);
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_SCRIPT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            "Error in script %s: %s",
				            config_options[DOCUMENT_ROOT].name,
				            ebuf);
			}
			pthread_mutex_unlock(&ctx->lua_bg_mutex);

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}

		/* state remains valid */
		ctx->lua_background_state = (void *)state;
		pthread_mutex_unlock(&ctx->lua_bg_mutex);

	} else {
		ctx->lua_background_state = 0;
	}
#endif

	/* Step by step initialization of ctx - depending on build options */
#if !defined(NO_FILESYSTEMS)
	if (!set_gpass_option(ctx, NULL)) {
		const char *err_msg = "Invalid global password file";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INVALID_PASS_FILE;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}
		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

#if defined(USE_MBEDTLS)
	if (!mg_sslctx_init(ctx, NULL)) {
		const char *err_msg = "Error initializing SSL context";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#elif !defined(NO_SSL)
	if (!init_ssl_ctx(ctx, NULL)) {
		const char *err_msg = "Error initializing SSL context";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	if (!set_ports_option(ctx)) {
		const char *err_msg = "Failed to setup server ports";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_PORTS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#if !defined(_WIN32) && !defined(__ZEPHYR__)
	if (!set_uid_option(ctx)) {
		const char *err_msg = "Failed to run as configured user";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_USER_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	if (!set_acl_option(ctx)) {
		const char *err_msg = "Failed to setup access control list";
		/* Fatal error - abort start. */
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_ACL_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	ctx->cfg_worker_threads = ((unsigned int)(workerthreadcount));
	ctx->worker_threadids = (pthread_t *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                                   sizeof(pthread_t),
	                                                   ctx);

	if (ctx->worker_threadids == NULL) {
		const char *err_msg = "Not enough memory for worker thread ID array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub =
			    (unsigned)ctx->cfg_worker_threads * (unsigned)sizeof(pthread_t);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
	ctx->worker_connections =
	    (struct mg_connection *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                          sizeof(struct mg_connection),
	                                          ctx);
	if (ctx->worker_connections == NULL) {
		const char *err_msg =
		    "Not enough memory for worker thread connection array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(struct mg_connection);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

#if defined(ALTERNATIVE_QUEUE)
	ctx->client_wait_events =
	    (void **)mg_calloc_ctx(ctx->cfg_worker_threads,
	                           sizeof(ctx->client_wait_events[0]),
	                           ctx);
	if (ctx->client_wait_events == NULL) {
		const char *err_msg = "Not enough memory for worker event array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);
		mg_free(ctx->worker_threadids);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(ctx->client_wait_events[0]);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	ctx->client_socks =
	    (struct socket *)mg_calloc_ctx(ctx->cfg_worker_threads,
	                                   sizeof(ctx->client_socks[0]),
	                                   ctx);
	if (ctx->client_socks == NULL) {
		const char *err_msg = "Not enough memory for worker socket array";
		mg_cry_ctx_internal(ctx, "%s", err_msg);
		mg_free(ctx->client_wait_events);
		mg_free(ctx->worker_threadids);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)ctx->cfg_worker_threads
			                  * (unsigned)sizeof(ctx->client_socks[0]);
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}

	for (i = 0; (unsigned)i < ctx->cfg_worker_threads; i++) {
		ctx->client_wait_events[i] = event_create();
		if (ctx->client_wait_events[i] == 0) {
			const char *err_msg = "Error creating worker event %i";
			mg_cry_ctx_internal(ctx, err_msg, i);
			while (i > 0) {
				i--;
				event_destroy(ctx->client_wait_events[i]);
			}
			mg_free(ctx->client_socks);
			mg_free(ctx->client_wait_events);
			mg_free(ctx->worker_threadids);

			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_OS_ERROR;
				error->code_sub = (unsigned)ERRNO;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for error buffers */
				            error->text,
				            error->text_buffer_size,
				            err_msg,
				            i);
			}

			free_context(ctx);
			pthread_setspecific(sTlsKey, NULL);
			return NULL;
		}
	}
#endif

#if defined(USE_TIMERS)
	if (timers_init(ctx) != 0) {
		const char *err_msg = "Error creating timers";
		mg_cry_ctx_internal(ctx, "%s", err_msg);

		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = (unsigned)ERRNO;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for error buffers */
			            error->text,
			            error->text_buffer_size,
			            "%s",
			            err_msg);
		}

		free_context(ctx);
		pthread_setspecific(sTlsKey, NULL);
		return NULL;
	}
#endif

	/* Context has been created - init user libraries */
	if (ctx->callbacks.init_context) {
		ctx->callbacks.init_context(ctx);
	}

	/* From now, the context is successfully created.
	 * When it is destroyed, the exit callback should be called. */
	ctx->callbacks.exit_context = exit_callback;
	ctx->context_type = CONTEXT_SERVER; /* server context */

	/* Start worker threads */
	for (i = 0; i < ctx->cfg_worker_threads; i++) {
		/* worker_thread sets up the other fields */
		ctx->worker_connections[i].phys_ctx = ctx;
		if (mg_start_thread_with_id(worker_thread,
		                            &ctx->worker_connections[i],
		                            &ctx->worker_threadids[i])
		    != 0) {

			long error_no = (long)ERRNO;

			/* thread was not created */
			if (i > 0) {
				/* If the second, third, ... thread cannot be created, set a
				 * warning, but keep running. */
				mg_cry_ctx_internal(ctx,
				                    "Cannot start worker thread %i: error %ld",
				                    i + 1,
				                    error_no);

				/* If the server initialization should stop here, all
				 * threads that have already been created must be stopped
				 * first, before any free_context(ctx) call.
				 */

			} else {
				/* If the first worker thread cannot be created, stop
				 * initialization and free the entire server context. */
				mg_cry_ctx_internal(ctx,
				                    "Cannot create threads: error %ld",
				                    error_no);

				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_OS_ERROR;
					error->code_sub = (unsigned)error_no;
					mg_snprintf(
					    NULL,
					    NULL, /* No truncation check for error buffers */
					    error->text,
					    error->text_buffer_size,
					    "Cannot create first worker thread: error %ld",
					    error_no);
				}

				free_context(ctx);
				pthread_setspecific(sTlsKey, NULL);
				return NULL;
			}
			break;
		}
	}

	/* Start master (listening) thread */
	mg_start_thread_with_id(master_thread, ctx, &ctx->masterthreadid);

	pthread_setspecific(sTlsKey, NULL);
	return ctx;
}